

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg.h
# Opt level: O0

string * __thiscall TCLAP::Arg::toString_abi_cxx11_(Arg *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  string *s;
  string *__lhs;
  string local_108 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  allocator<char> *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [54];
  allocator<char> local_12;
  undefined1 local_11;
  
  local_11 = 0;
  __lhs = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  std::allocator<char>::~allocator(&local_12);
  bVar1 = std::operator!=(in_RSI,(char *)in_RDI);
  if (bVar1) {
    flagStartString_abi_cxx11_();
    std::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    std::operator+(__lhs,(char *)in_RSI);
    std::__cxx11::string::operator+=((string *)__lhs,local_48);
    std::__cxx11::string::~string(local_48);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
  }
  nameStartString_abi_cxx11_();
  std::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::operator+(__lhs,in_RSI);
  std::operator+(__lhs,(char *)in_RSI);
  std::__cxx11::string::operator+=((string *)__lhs,local_a8);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff18);
  std::__cxx11::string::~string(local_108);
  return in_RDI;
}

Assistant:

inline std::string Arg::toString() const
{
	std::string s = "";

	if ( _flag != "" )
		s += Arg::flagStartString() + _flag + " ";

	s += "(" + Arg::nameStartString() + _name + ")";

	return s;
}